

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::FboCases::RecreateBuffersTest::render
          (RecreateBuffersTest *this,Context *ctx,Surface *dst)

{
  FboConfig *config;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  DataType DVar4;
  DataType outputType;
  deUint32 program;
  deUint32 program_00;
  deUint32 program_01;
  GLenum GVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  undefined8 uVar10;
  int ndx;
  int iVar11;
  GLenum GVar12;
  int in_R9D;
  Vector<float,_4> res_1;
  Framebuffer fbo;
  TextureFormat colorFormat;
  Vec3 local_538;
  Vec4 fboOutBias;
  Vec4 fboOutScale;
  TextureFormatInfo fboRangeInfo;
  FlatColorShader flatShader;
  Texture2DShader texFromFboShader;
  Texture2DShader texToFboShader;
  
  colorFormat = glu::mapGLInternalFormat((this->super_FboRenderCase).m_config.colorFormat);
  DVar4 = glu::getSampler2DType(colorFormat);
  outputType = FboTestUtil::getFragmentOutputType(&colorFormat);
  tcu::getTextureFormatInfo(&fboRangeInfo,&colorFormat);
  fboOutScale.m_data[0] = fboRangeInfo.valueMax.m_data[0] - fboRangeInfo.valueMin.m_data[0];
  fboOutScale.m_data[1] = fboRangeInfo.valueMax.m_data[1] - fboRangeInfo.valueMin.m_data[1];
  fboOutScale.m_data[2] = fboRangeInfo.valueMax.m_data[2] - fboRangeInfo.valueMin.m_data[2];
  fboOutScale.m_data[3] = fboRangeInfo.valueMax.m_data[3] - fboRangeInfo.valueMin.m_data[3];
  fboOutBias.m_data[1] = fboRangeInfo.valueMin.m_data[1];
  fboOutBias.m_data[0] = fboRangeInfo.valueMin.m_data[0];
  fboOutBias.m_data[3] = fboRangeInfo.valueMin.m_data[3];
  fboOutBias.m_data[2] = fboRangeInfo.valueMin.m_data[2];
  texFromFboShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  texFromFboShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texFromFboShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
       (_func_int **)
       CONCAT44(flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader._4_4_,0x28);
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&texFromFboShader,(iterator)0x0,
             (DataType *)&flatShader);
  flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
       (_func_int **)0x3f8000003f800000;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
  fbo.m_config.buffers = 0;
  fbo.m_config.colorType = 0;
  fbo.m_config.colorFormat = 0;
  fbo.m_config.depthStencilType = 0;
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texToFboShader,(DataTypes *)&texFromFboShader,outputType,(Vec4 *)&flatShader,
             (Vec4 *)&fbo);
  if (texFromFboShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader !=
      (_func_int **)0x0) {
    operator_delete(texFromFboShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader,
                    (long)texFromFboShader.super_ShaderProgram.super_VertexShader.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)texFromFboShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader
                   );
  }
  flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fbo.m_config.buffers = DVar4;
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&flatShader,(iterator)0x0,
             (DataType *)&fbo);
  fbo.m_config.buffers = 0x3f800000;
  fbo.m_config.colorType = 0x3f800000;
  fbo.m_config.colorFormat = 0x3f800000;
  fbo.m_config.depthStencilType = 0x3f800000;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texFromFboShader,(DataTypes *)&flatShader,TYPE_FLOAT_VEC4,(Vec4 *)&fbo,&res_1);
  if (flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader != (_func_int **)0x0) {
    operator_delete(flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader,
                    (long)flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader);
  }
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,outputType);
  program = (*ctx->_vptr_Context[0x75])(ctx,&texToFboShader);
  program_00 = (*ctx->_vptr_Context[0x75])(ctx,&texFromFboShader);
  program_01 = (*ctx->_vptr_Context[0x75])(ctx,&flatShader);
  config = &(this->super_FboRenderCase).m_config;
  uVar6 = config->buffers;
  createQuadsTex2D(ctx,2,0x1907,0x40,0x40,in_R9D);
  createMetaballsTex2D(ctx,1,0x1907,0x40,0x40,in_R9D);
  Framebuffer::Framebuffer(&fbo,ctx,config,0x80,0x80,0,0,0);
  Framebuffer::checkCompleteness(&fbo);
  FboTestUtil::Texture2DShader::setOutScaleBias(&texToFboShader,&fboOutScale,&fboOutBias);
  FboTestUtil::Texture2DShader::setTexScaleBias
            (&texFromFboShader,0,&fboRangeInfo.lookupScale,&fboRangeInfo.lookupBias);
  FboTestUtil::Texture2DShader::setUniforms(&texToFboShader,ctx,program);
  FboTestUtil::Texture2DShader::setUniforms(&texFromFboShader,ctx,program_00);
  res_1.m_data[1] = fboOutScale.m_data[1] * 0.0 + fboOutBias.m_data[1];
  res_1.m_data[0] = fboOutScale.m_data[0] * 0.0 + fboOutBias.m_data[0];
  res_1.m_data[3] = fboOutScale.m_data[3] * 1.0 + fboOutBias.m_data[3];
  res_1.m_data[2] = fboOutScale.m_data[2] * 1.0 + fboOutBias.m_data[2];
  FboTestUtil::FlatColorShader::setColor(&flatShader,ctx,program_01,&res_1);
  (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)fbo.m_framebuffer);
  (*ctx->_vptr_Context[5])(ctx,0,0,0x80,0x80);
  res_1.m_data[0] = 1.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 1.0;
  FboTestUtil::clearColorBuffer(ctx,&colorFormat,&res_1);
  (*ctx->_vptr_Context[0x2d])(ctx,0x500);
  (*ctx->_vptr_Context[0x33])(ctx,0xb71);
  (*ctx->_vptr_Context[6])(ctx,0xde1,2);
  res_1.m_data[0] = -1.0;
  res_1.m_data[1] = -1.0;
  res_1.m_data._8_8_ = res_1.m_data._8_8_ & 0xffffffff00000000;
  local_538.m_data[0] = 1.0;
  local_538.m_data[1] = 1.0;
  local_538.m_data[2] = 0.0;
  sglr::drawQuad(ctx,program,(Vec3 *)&res_1,&local_538);
  (*ctx->_vptr_Context[0x34])(ctx,0xb71);
  if ((uVar6 >> 10 & 1) != 0) {
    (*ctx->_vptr_Context[0x33])(ctx,0xc11);
    (*ctx->_vptr_Context[0x32])(ctx,0x20,0x20,0x40,0x40);
    (*ctx->_vptr_Context[0x2c])(ctx,1);
    (*ctx->_vptr_Context[0x2d])(ctx,0x400);
    (*ctx->_vptr_Context[0x34])(ctx,0xc11);
  }
  if (this->m_rebind == false) {
    (*ctx->_vptr_Context[9])(ctx,0x8d40,0);
  }
  bVar2 = true;
  do {
    bVar1 = bVar2;
    uVar7 = 0x500;
    if (bVar1) {
      uVar7 = 0x4000;
      GVar5 = fbo.m_config.colorType;
      GVar12 = fbo.m_config.colorFormat;
      fVar9 = (float)fbo.m_colorBuffer;
    }
    else {
      GVar5 = fbo.m_config.depthStencilType;
      GVar12 = fbo.m_config.depthStencilFormat;
      fVar9 = (float)fbo.m_depthStencilBuffer;
    }
    res_1.m_data[0] = fVar9;
    if ((this->m_buffers & uVar7) != 0) {
      if (GVar5 == 0x8d41) {
        (*ctx->_vptr_Context[0xe])(ctx,1,&res_1);
        (*ctx->_vptr_Context[0xc])(ctx,0x8d41,res_1.m_data._0_8_ & 0xffffffff);
        (*ctx->_vptr_Context[0x23])(ctx,0x8d41,(ulong)GVar12,0x80,0x80);
      }
      else if (GVar5 == 0xde1) {
        (*ctx->_vptr_Context[8])(ctx,1,&res_1);
        (*ctx->_vptr_Context[6])(ctx,0xde1,res_1.m_data._0_8_ & 0xffffffff);
        (*ctx->_vptr_Context[0x7e])(ctx,0xde1,0,(ulong)GVar12,0x80,0x80);
        (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2801,0x2600);
        (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2800,0x2600);
      }
    }
    bVar2 = false;
  } while (bVar1);
  bVar3 = this->m_rebind;
  if ((bool)bVar3 == true) {
    iVar11 = 0;
    do {
      if (iVar11 == 0) {
        uVar10 = 0x8ce0;
        uVar8 = 0x4000;
        GVar5 = fbo.m_config.colorType;
        uVar7 = fbo.m_colorBuffer;
      }
      else {
        if (iVar11 == 1) {
          uVar10 = 0x8d00;
          uVar8 = 0x100;
        }
        else {
          uVar10 = 0x8d20;
          uVar8 = 0x400;
        }
        GVar5 = fbo.m_config.depthStencilType;
        uVar7 = fbo.m_depthStencilBuffer;
      }
      if ((this->m_buffers & uVar8) != 0) {
        if (GVar5 == 0x8d41) {
          (*ctx->_vptr_Context[0x20])(ctx,0x8d40,uVar10,0x8d41,(ulong)uVar7);
        }
        else if (GVar5 == 0xde1) {
          (*ctx->_vptr_Context[0x1e])(ctx,0x8d40,uVar10,0xde1,(ulong)uVar7,0);
        }
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != 3);
    bVar3 = this->m_rebind;
  }
  if ((bVar3 & 1) == 0) {
    (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)fbo.m_framebuffer);
  }
  (*ctx->_vptr_Context[0x2c])(ctx,0);
  (*ctx->_vptr_Context[0x2d])(ctx,(ulong)(this->m_buffers & 0x500));
  if ((this->m_buffers & 0x4000) != 0) {
    res_1.m_data[0] = -1.0;
    res_1.m_data[1] = -1.0;
    res_1.m_data._8_8_ = res_1.m_data._8_8_ & 0xffffffff00000000;
    local_538.m_data[0] = 1.0;
    local_538.m_data[1] = 1.0;
    local_538.m_data[2] = 0.0;
    sglr::drawQuad(ctx,program_01,(Vec3 *)&res_1,&local_538);
  }
  (*ctx->_vptr_Context[0x33])(ctx,0xb71);
  if ((uVar6 >> 10 & 1) != 0) {
    (*ctx->_vptr_Context[0x33])(ctx,0xb90);
    (*ctx->_vptr_Context[0x35])(ctx,0x202,0,0xff);
  }
  (*ctx->_vptr_Context[6])(ctx,0xde1,1);
  res_1.m_data[0] = -1.0;
  res_1.m_data[1] = -1.0;
  res_1.m_data[2] = 1.0;
  local_538.m_data[0] = 1.0;
  local_538.m_data[1] = 1.0;
  local_538.m_data[2] = -1.0;
  sglr::drawQuad(ctx,program,(Vec3 *)&res_1,&local_538);
  if ((uVar6 >> 10 & 1) != 0) {
    (*ctx->_vptr_Context[0x34])(ctx,0xb90);
  }
  (*ctx->_vptr_Context[0x34])(ctx,0xb71);
  if (fbo.m_config.colorType == 0xde1) {
    (*ctx->_vptr_Context[9])(ctx,0x8d40,0);
    (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)fbo.m_colorBuffer);
    uVar6 = (*ctx->_vptr_Context[2])(ctx);
    uVar7 = (*ctx->_vptr_Context[3])(ctx);
    (*ctx->_vptr_Context[5])(ctx,0,0,(ulong)uVar6,(ulong)uVar7);
    res_1.m_data[0] = -1.0;
    res_1.m_data[1] = -1.0;
    res_1.m_data._8_8_ = res_1.m_data._8_8_ & 0xffffffff00000000;
    local_538.m_data[0] = 1.0;
    local_538.m_data[1] = 1.0;
    local_538.m_data[2] = 0.0;
    sglr::drawQuad(ctx,program_00,(Vec3 *)&res_1,&local_538);
    uVar6 = (*ctx->_vptr_Context[2])(ctx);
    uVar7 = (*ctx->_vptr_Context[3])(ctx);
    (*ctx->_vptr_Context[0x80])(ctx,dst,0,0,(ulong)uVar6,(ulong)uVar7);
  }
  else {
    FboTestUtil::readPixels
              (ctx,dst,0,0,0x80,0x80,&colorFormat,&fboRangeInfo.lookupScale,&fboRangeInfo.lookupBias
              );
  }
  Framebuffer::~Framebuffer(&fbo);
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texFromFboShader);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texToFboShader);
  return;
}

Assistant:

void RecreateBuffersTest::render (sglr::Context& ctx, Surface& dst)
{
	tcu::TextureFormat		colorFormat			= glu::mapGLInternalFormat(m_config.colorFormat);
	glu::DataType			fboSamplerType		= glu::getSampler2DType(colorFormat);
	glu::DataType			fboOutputType		= getFragmentOutputType(colorFormat);
	tcu::TextureFormatInfo	fboRangeInfo		= tcu::getTextureFormatInfo(colorFormat);
	Vec4					fboOutScale			= fboRangeInfo.valueMax - fboRangeInfo.valueMin;
	Vec4					fboOutBias			= fboRangeInfo.valueMin;

	Texture2DShader			texToFboShader		(DataTypes() << glu::TYPE_SAMPLER_2D, fboOutputType);
	Texture2DShader			texFromFboShader	(DataTypes() << fboSamplerType, glu::TYPE_FLOAT_VEC4);
	FlatColorShader			flatShader			(fboOutputType);
	deUint32				texToFboShaderID	= ctx.createProgram(&texToFboShader);
	deUint32				texFromFboShaderID	= ctx.createProgram(&texFromFboShader);
	deUint32				flatShaderID		= ctx.createProgram(&flatShader);

	int						width				= 128;
	int						height				= 128;
	deUint32				metaballsTex		= 1;
	deUint32				quadsTex			= 2;
	bool					stencil				= (m_config.buffers & GL_STENCIL_BUFFER_BIT) != 0;

	createQuadsTex2D(ctx, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createMetaballsTex2D(ctx, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);

	Framebuffer fbo(ctx, m_config, width, height);
	fbo.checkCompleteness();

	// Setup shaders
	texToFboShader.setOutScaleBias(fboOutScale, fboOutBias);
	texFromFboShader.setTexScaleBias(0, fboRangeInfo.lookupScale, fboRangeInfo.lookupBias);
	texToFboShader.setUniforms	(ctx, texToFboShaderID);
	texFromFboShader.setUniforms(ctx, texFromFboShaderID);
	flatShader.setColor			(ctx, flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f) * fboOutScale + fboOutBias);

	// Draw scene
	ctx.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	ctx.viewport(0, 0, width, height);
	clearColorBuffer(ctx, colorFormat, tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	ctx.clear(GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	ctx.enable(GL_DEPTH_TEST);

	ctx.bindTexture(GL_TEXTURE_2D, quadsTex);
	sglr::drawQuad(ctx, texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	ctx.disable(GL_DEPTH_TEST);

	if (stencil)
	{
		ctx.enable(GL_SCISSOR_TEST);
		ctx.scissor(width/4, height/4, width/2, height/2);
		ctx.clearStencil(1);
		ctx.clear(GL_STENCIL_BUFFER_BIT);
		ctx.disable(GL_SCISSOR_TEST);
	}

	// Recreate buffers
	if (!m_rebind)
		ctx.bindFramebuffer(GL_FRAMEBUFFER, 0);

	DE_ASSERT((m_buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)) == 0 ||
			  (m_buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)) == (m_config.buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)));

	// Recreate.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		deUint32	bit		= ndx == 0 ? GL_COLOR_BUFFER_BIT
									   : (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
		deUint32	type	= ndx == 0 ? fbo.getConfig().colorType
									   : fbo.getConfig().depthStencilType;
		deUint32	format	= ndx == 0 ? fbo.getConfig().colorFormat
									   : fbo.getConfig().depthStencilFormat;
		deUint32	buf		= ndx == 0 ? fbo.getColorBuffer()
									   : fbo.getDepthStencilBuffer();

		if ((m_buffers & bit) == 0)
			continue;

		switch (type)
		{
			case GL_TEXTURE_2D:
				ctx.deleteTextures(1, &buf);
				ctx.bindTexture(GL_TEXTURE_2D, buf);
				ctx.texImage2D(GL_TEXTURE_2D, 0, format, width, height);
				ctx.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
				ctx.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
				break;

			case GL_RENDERBUFFER:
				ctx.deleteRenderbuffers(1, &buf);
				ctx.bindRenderbuffer(GL_RENDERBUFFER, buf);
				ctx.renderbufferStorage(GL_RENDERBUFFER, format, width, height);
				break;

			default:
				DE_ASSERT(false);
		}
	}

	// Rebind.
	if (m_rebind)
	{
		for (int ndx = 0; ndx < 3; ndx++)
		{
			deUint32	bit		= ndx == 0 ? GL_COLOR_BUFFER_BIT	:
								  ndx == 1 ? GL_DEPTH_BUFFER_BIT	:
								  ndx == 2 ? GL_STENCIL_BUFFER_BIT	: 0;
			deUint32	point	= ndx == 0 ? GL_COLOR_ATTACHMENT0	:
								  ndx == 1 ? GL_DEPTH_ATTACHMENT	:
								  ndx == 2 ? GL_STENCIL_ATTACHMENT	: 0;
			deUint32	type	= ndx == 0 ? fbo.getConfig().colorType
										   : fbo.getConfig().depthStencilType;
			deUint32	buf		= ndx == 0 ? fbo.getColorBuffer()
										   : fbo.getDepthStencilBuffer();

			if ((m_buffers & bit) == 0)
				continue;

			switch (type)
			{
				case GL_TEXTURE_2D:
					ctx.framebufferTexture2D(GL_FRAMEBUFFER, point, GL_TEXTURE_2D, buf, 0);
					break;

				case GL_RENDERBUFFER:
					ctx.framebufferRenderbuffer(GL_FRAMEBUFFER, point, GL_RENDERBUFFER, buf);
					break;

				default:
					DE_ASSERT(false);
			}
		}
	}

	if (!m_rebind)
		ctx.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());

	ctx.clearStencil(0);
	ctx.clear(m_buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)); // \note Clear only buffers that were re-created
	if (m_buffers & GL_COLOR_BUFFER_BIT)
	{
		// Clearing of integer buffers is undefined so do clearing by rendering flat color.
		sglr::drawQuad(ctx, flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
	}

	ctx.enable(GL_DEPTH_TEST);

	if (stencil)
	{
		// \note Stencil test enabled only if we have stencil buffer
		ctx.enable(GL_STENCIL_TEST);
		ctx.stencilFunc(GL_EQUAL, 0, 0xffu);
	}
	ctx.bindTexture(GL_TEXTURE_2D, metaballsTex);
	sglr::drawQuad(ctx, texToFboShaderID, Vec3(-1.0f, -1.0f, 1.0f), Vec3(1.0f, 1.0f, -1.0f));
	if (stencil)
		ctx.disable(GL_STENCIL_TEST);

	ctx.disable(GL_DEPTH_TEST);

	if (fbo.getConfig().colorType == GL_TEXTURE_2D)
	{
		// Unbind fbo
		ctx.bindFramebuffer(GL_FRAMEBUFFER, 0);

		// Draw to screen
		ctx.bindTexture(GL_TEXTURE_2D, fbo.getColorBuffer());
		ctx.viewport(0, 0, ctx.getWidth(), ctx.getHeight());
		sglr::drawQuad(ctx, texFromFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Read from screen
		ctx.readPixels(dst, 0, 0, ctx.getWidth(), ctx.getHeight());
	}
	else
	{
		// Read from fbo
		readPixels(ctx, dst, 0, 0, width, height, colorFormat, fboRangeInfo.lookupScale, fboRangeInfo.lookupBias);
	}
}